

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall
tinyxml2::XMLPrinter::VisitEnter(XMLPrinter *this,XMLElement *element,XMLAttribute *attribute)

{
  int iVar1;
  XMLNode *pXVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *value;
  byte local_39;
  long lStack_28;
  bool compactMode;
  XMLElement *parentElem;
  XMLAttribute *attribute_local;
  XMLElement *element_local;
  XMLPrinter *this_local;
  
  lStack_28 = 0;
  pXVar2 = XMLNode::Parent(&element->super_XMLNode);
  if (pXVar2 != (XMLNode *)0x0) {
    pXVar2 = XMLNode::Parent(&element->super_XMLNode);
    iVar1 = (*pXVar2->_vptr_XMLNode[6])();
    lStack_28 = CONCAT44(extraout_var,iVar1);
  }
  if (lStack_28 == 0) {
    local_39 = this->_compactMode;
  }
  else {
    iVar1 = (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xb])(this,lStack_28);
    local_39 = (byte)iVar1;
  }
  pcVar3 = XMLElement::Name(element);
  OpenElement(this,pcVar3,(bool)(local_39 & 1));
  for (parentElem = (XMLElement *)attribute; parentElem != (XMLElement *)0x0;
      parentElem = (XMLElement *)XMLAttribute::Next((XMLAttribute *)parentElem)) {
    pcVar3 = XMLAttribute::Name((XMLAttribute *)parentElem);
    value = XMLAttribute::Value((XMLAttribute *)parentElem);
    PushAttribute(this,pcVar3,value);
  }
  return true;
}

Assistant:

bool XMLPrinter::VisitEnter( const XMLElement& element, const XMLAttribute* attribute )
{
    const XMLElement* parentElem = 0;
    if ( element.Parent() ) {
        parentElem = element.Parent()->ToElement();
    }
    const bool compactMode = parentElem ? CompactMode( *parentElem ) : _compactMode;
    OpenElement( element.Name(), compactMode );
    while ( attribute ) {
        PushAttribute( attribute->Name(), attribute->Value() );
        attribute = attribute->Next();
    }
    return true;
}